

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O3

void __thiscall
LargeGapGrayCode::computeMaxGap
          (LargeGapGrayCode *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *runLengths,
          int *maxGap,int *maxCount)

{
  _Rb_tree_node_base *p_Var1;
  
  *maxGap = 0;
  for (p_Var1 = (runLengths->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(runLengths->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*maxGap < (int)p_Var1[1]._M_color) {
      *maxGap = p_Var1[1]._M_color;
      *maxCount = *(int *)&p_Var1[1].field_0x4;
    }
  }
  return;
}

Assistant:

void LargeGapGrayCode::computeMaxGap(const std::map<int, int>& runLengths, int& maxGap, int& maxCount)
{
	maxGap = 0;

	for(std::map<int, int>::const_iterator it = runLengths.begin(); it != runLengths.end(); ++it) {
		if(it->first > maxGap) {
			maxGap = it->first;
			maxCount = it->second;
		}
	}
}